

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O3

int Abc_NodeStrashToGia(Gia_Man_t *pNew,Abc_Obj_t *pNode)

{
  Abc_Ntk_t *pAVar1;
  Hop_Man_t *p;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 aVar2;
  int iVar3;
  Hop_Obj_t *pHVar4;
  uint uVar5;
  long lVar6;
  Hop_Obj_t *pObj;
  
  if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                  ,0x3d,"int Abc_NodeStrashToGia(Gia_Man_t *, Abc_Obj_t *)");
  }
  pAVar1 = pNode->pNtk;
  if ((pAVar1->ntkFunc != ABC_FUNC_AIG) || (pAVar1->ntkType == ABC_NTK_STRASH)) {
    __assert_fail("Abc_NtkHasAig(pNode->pNtk) && !Abc_NtkIsStrash(pNode->pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                  ,0x3e,"int Abc_NodeStrashToGia(Gia_Man_t *, Abc_Obj_t *)");
  }
  p = (Hop_Man_t *)pAVar1->pManFunc;
  aVar2 = pNode->field_5;
  iVar3 = Abc_NodeIsConst(pNode);
  uVar5 = aVar2.iData;
  if ((iVar3 == 0) &&
     (pObj = (Hop_Obj_t *)((ulong)aVar2.pData & 0xfffffffffffffffe), p->pConst1 != pObj)) {
    iVar3 = (pNode->vFanins).nSize;
    if (0 < (long)iVar3) {
      lVar6 = 0;
      do {
        if (*(int *)((long)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar6]] + 0x40) == -1)
        {
          __assert_fail("pFanin->iTemp != -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                        ,0x44,"int Abc_NodeStrashToGia(Gia_Man_t *, Abc_Obj_t *)");
        }
        lVar6 = lVar6 + 1;
      } while (iVar3 != lVar6);
      if (0 < iVar3) {
        lVar6 = 0;
        do {
          iVar3 = *(int *)((long)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar6]] + 0x40);
          pHVar4 = Hop_IthVar(p,(int)lVar6);
          (pHVar4->field_0).iData = iVar3;
          lVar6 = lVar6 + 1;
        } while (lVar6 < (pNode->vFanins).nSize);
      }
    }
    Abc_NodeStrashToGia_rec(pNew,pObj);
    Hop_ConeUnmark_rec(pObj);
    if ((pObj->field_0).iData < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x132,"int Abc_LitNotCond(int, int)");
    }
    uVar5 = (pObj->field_0).iData ^ uVar5 & 1;
  }
  else {
    uVar5 = ~uVar5 & 1;
  }
  return uVar5;
}

Assistant:

int Abc_NodeStrashToGia( Gia_Man_t * pNew, Abc_Obj_t * pNode )
{
    Hop_Man_t * pMan = (Hop_Man_t *)pNode->pNtk->pManFunc;
    Hop_Obj_t * pRoot = (Hop_Obj_t *)pNode->pData;
    Abc_Obj_t * pFanin;  int i;
    assert( Abc_ObjIsNode(pNode) );
    assert( Abc_NtkHasAig(pNode->pNtk) && !Abc_NtkIsStrash(pNode->pNtk) );
    // check the constant case
    if ( Abc_NodeIsConst(pNode) || Hop_Regular(pRoot) == Hop_ManConst1(pMan) )
        return Abc_LitNotCond( 1, Hop_IsComplement(pRoot) );
    // set elementary variables
    Abc_ObjForEachFanin( pNode, pFanin, i )
        assert( pFanin->iTemp != -1 );
    Abc_ObjForEachFanin( pNode, pFanin, i )
        Hop_IthVar(pMan, i)->iData = pFanin->iTemp;
    // strash the AIG of this node
    Abc_NodeStrashToGia_rec( pNew, Hop_Regular(pRoot) );
    Hop_ConeUnmark_rec( Hop_Regular(pRoot) );
    return Abc_LitNotCond( Hop_Regular(pRoot)->iData, Hop_IsComplement(pRoot) );
}